

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall Liby::TcpServer::handleAcceptEvent(TcpServer *this)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Endpoint EVar3;
  _Any_data *in_RCX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  SockPtr sock;
  ConnPtr connPtr;
  undefined4 local_98;
  undefined1 local_91 [9];
  undefined1 local_88 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  Endpoint local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  ChanPtr local_40;
  
  if (this->listenfd_ < 0) {
    __assert_fail("listenfd_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp"
                  ,0x23,"void Liby::TcpServer::handleAcceptEvent()");
  }
  do {
    Socket::accept((Socket *)local_88,
                   (int)(this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,in_RDX,(socklen_t *)in_RCX->_M_pod_data);
    uVar1 = local_88._0_8_;
    in_RDX = extraout_RDX;
    if (local_88._0_8_ != 0) {
      if (this->loop_ == (EventLoop *)0x0) {
        __assert_fail("sock && loop_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp"
                      ,0x2a,"void Liby::TcpServer::handleAcceptEvent()");
      }
      local_68._M_unused._M_object = EventLoop::robinLoop(this->loop_,*(int *)(local_88._0_8_ + 4));
      std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<Liby::Connection>,Liby::EventLoop*,std::shared_ptr<Liby::Socket>&>
                ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                 (allocator<Liby::Connection> *)&local_98,(EventLoop **)&local_68,
                 (shared_ptr<Liby::Socket> *)local_88);
      initConnection(this,(Connection *)local_78._M_pi);
      _Var2._M_pi = local_78._M_pi;
      if ((Poller *)local_78._M_pi[7]._vptr__Sp_counted_base == (Poller *)0x0) {
        __assert_fail("poller_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.h"
                      ,0x28,"Poller *Liby::Connection::getPoller()");
      }
      local_98 = *(undefined4 *)(local_88._0_8_ + 4);
      local_40.super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      in_RCX = &local_68;
      local_68._M_unused._M_object = (Poller *)local_78._M_pi[7]._vptr__Sp_counted_base;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Liby::Channel,std::allocator<Liby::Channel>,Liby::Poller*,int>
                (&local_40.super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(Channel **)&local_40,(allocator<Liby::Channel> *)local_91,(Poller **)&local_68,
                 (int *)&local_98);
      Connection::setChannel((Connection *)_Var2._M_pi,&local_40);
      if (local_40.super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      EVar3 = local_70;
      _Var2._M_pi = local_78._M_pi;
      if (local_70 != (Endpoint)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_70 + 8) = *(_Atomic_word *)((long)local_70 + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_70 + 8) = *(_Atomic_word *)((long)local_70 + 8) + 1;
        }
      }
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_68._M_unused._M_object = operator_new(0x18);
      *(TcpServer **)local_68._M_unused._0_8_ = this;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_68._M_unused._0_8_ + 8) =
           _Var2._M_pi;
      *(Endpoint *)((long)local_68._M_unused._0_8_ + 0x10) = EVar3;
      pcStack_50 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:48:38)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:48:38)>
                 ::_M_manager;
      Connection::runEventHandler((Connection *)_Var2._M_pi,(BasicHandler *)&local_68);
      in_RDX = extraout_RDX_00;
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
        in_RDX = extraout_RDX_01;
      }
      if (local_70 != (Endpoint)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70);
        in_RDX = extraout_RDX_02;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      in_RDX = extraout_RDX_03;
    }
    if (uVar1 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void TcpServer::handleAcceptEvent() {
    assert(listenfd_ >= 0);
    for (;;) {
        try {
            auto sock = socket_->accept();
            if (!sock) {
                return;
            }
            assert(sock && loop_);
            ConnPtr connPtr = std::make_shared<Connection>(
                loop_->robinLoop(sock->fd()), sock);
            initConnection(*connPtr);
            connPtr->setChannel(
                std::make_shared<Channel>(connPtr->getPoller(), sock->fd()));
            connPtr->runEventHandler([this, connPtr] {
                connPtr->init();
                connPtr->init1();
                connPtr->enableRead();
                if (acceptorCallback_) {
                    acceptorCallback_(*connPtr);
                }
            });
        } catch (const char *err) {
            debug("accept: %s", err);
            handleErroEvent();
        }
    }
}